

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

string * gnuplotio::Gnuplot::get_default_cmd_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  char *local_18;
  char *from_env;
  
  __s = getenv("GNUPLOT_IOSTREAM_CMD");
  local_18 = __s;
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"gnuplot -persist",local_2d)
    ;
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

static std::string get_default_cmd() {
        GNUPLOT_MSVC_WARNING_4996_PUSH
        char *from_env = std::getenv("GNUPLOT_IOSTREAM_CMD");
        GNUPLOT_MSVC_WARNING_4996_POP
        if(from_env && from_env[0]) {
            return from_env;
        } else {
            return GNUPLOT_DEFAULT_COMMAND;
        }
    }